

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O1

void __thiscall
lodepng::ExtractZlib::inflateNoCompression
          (ExtractZlib *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uchar *in,
          size_t *bp,size_t *pos,size_t inlength)

{
  pointer *ppuVar1;
  iterator __position;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar3 = *bp;
  if ((uVar3 & 7) != 0) {
    uVar3 = (uVar3 | 7) + 1;
    *bp = uVar3;
  }
  uVar3 = uVar3 >> 3;
  if (uVar3 < inlength - 4) {
    uVar2 = (ulong)*(ushort *)(in + uVar3);
    if ((uint)*(ushort *)(in + uVar3 + 2) + (uint)*(ushort *)(in + uVar3) == 0xffff) {
      if (inlength < uVar3 + 4 + uVar2) {
        this->error = 0x17;
      }
      else {
        lVar4 = uVar3 + 4;
        for (; uVar2 != 0; uVar2 = uVar2 - 1) {
          __position._M_current =
               (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,__position,
                       in + lVar4);
          }
          else {
            *__position._M_current = in[lVar4];
            ppuVar1 = &(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
          *pos = *pos + 1;
          lVar4 = lVar4 + 1;
        }
        *bp = lVar4 << 3;
      }
    }
    else {
      this->error = 0x15;
    }
  }
  else {
    this->error = 0x34;
  }
  return;
}

Assistant:

void inflateNoCompression(std::vector<unsigned char>& out,
                            const unsigned char* in, size_t& bp, size_t& pos, size_t inlength) {
    while((bp & 0x7) != 0) bp++; //go to first boundary of byte
    size_t p = bp / 8;
    if(p >= inlength - 4) { error = 52; return; } //error, bit pointer will jump past memory
    unsigned long LEN = in[p] + 256u * in[p + 1], NLEN = in[p + 2] + 256u * in[p + 3]; p += 4;
    if(LEN + NLEN != 65535) { error = 21; return; } //error: NLEN is not one's complement of LEN
    if(p + LEN > inlength) { error = 23; return; } //error: reading outside of in buffer
    for(unsigned long n = 0; n < LEN; n++) {
      out.push_back(in[p++]); //read LEN bytes of literal data
      pos++;
    }
    bp = p * 8;
  }